

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

IceTImage icetDrawFrame(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,
                       IceTFloat *background_color)

{
  int iVar1;
  int iVar2;
  IceTInt *pIVar3;
  IceTInt num_pixels;
  IceTInt *tile_viewports;
  IceTInt tile_displayed;
  IceTEnum strategy;
  IceTBoolean isDrawing;
  IceTBoolean need_color_correction;
  double dStack_58;
  IceTUInt background_color_word;
  IceTDouble total_time;
  IceTDouble compose_time;
  IceTDouble buf_read_time;
  IceTDouble render_time;
  IceTImage image;
  IceTInt frame_count;
  IceTFloat *background_color_local;
  IceTDouble *modelview_matrix_local;
  IceTDouble *projection_matrix_local;
  
  icetGetBooleanv(0x80,(IceTBoolean *)((long)&tile_displayed + 2));
  if (tile_displayed._2_1_ == '\0') {
    icetStateResetTiming();
    icetTimingDrawFrameBegin();
    icetStateSetDoublev(0x81,0x10,projection_matrix);
    icetStateSetDoublev(0x82,0x10,modelview_matrix);
    drawUseBackgroundColor(background_color,&strategy,(IceTBoolean *)((long)&tile_displayed + 3));
    icetGetIntegerv(0x2e,(IceTInt *)((long)&image.opaque_internals + 4));
    image.opaque_internals._4_4_ = image.opaque_internals._4_4_ + 1;
    icetStateSetIntegerv(0x2e,1,(IceTInt *)((long)&image.opaque_internals + 4));
    drawProjectBounds();
    icetGetEnumv(0x24,(IceTEnum *)((long)&tile_viewports + 4));
    if (tile_viewports._4_4_ != 0x6002) {
      drawCollectTileInformation();
    }
    icetGetIntegerv(0x1b,(IceTInt *)&tile_viewports);
    if ((int)tile_viewports < 0) {
      icetStateSetInteger(0x8c,-1);
      icetStateSetInteger(0x8d,0);
      icetStateSetInteger(0x8e,0);
    }
    else {
      pIVar3 = icetUnsafeStateGetInteger(0x11);
      iVar1 = pIVar3[(int)tile_viewports * 4 + 2];
      iVar2 = pIVar3[(int)tile_viewports * 4 + 3];
      icetStateSetInteger(0x8c,(int)tile_viewports);
      icetStateSetInteger(0x8d,0);
      icetStateSetInteger(0x8e,iVar1 * iVar2);
    }
    render_time = (IceTDouble)drawInvokeStrategy();
    if (tile_displayed._3_1_ != '\0') {
      drawCorrectBackground((IceTImage)render_time,background_color,strategy);
    }
    icetGetDoublev(0xc1,&buf_read_time);
    icetGetDoublev(0xc2,&compose_time);
    icetTimingDrawFrameEnd();
    icetGetDoublev(200,(IceTDouble *)&stack0xffffffffffffffa8);
    total_time = (IceTDouble)((dStack_58 - (double)buf_read_time) - (double)compose_time);
    icetStateSetDouble(0xc6,total_time);
    icetStateSetDouble(0xc3,0.0);
    icetStateCheckMemory();
    projection_matrix_local = (IceTDouble *)render_time;
  }
  else {
    icetRaiseDiagnostic("Recursive frame draw detected.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x30d);
    projection_matrix_local = (IceTDouble *)icetImageNull();
  }
  return (IceTImage)projection_matrix_local;
}

Assistant:

IceTImage icetDrawFrame(const IceTDouble *projection_matrix,
                        const IceTDouble *modelview_matrix,
                        const IceTFloat *background_color)
{
    IceTInt frame_count;
    IceTImage image;
    IceTDouble render_time;
    IceTDouble buf_read_time;
    IceTDouble compose_time;
    IceTDouble total_time;
    IceTUInt background_color_word;
    IceTBoolean need_color_correction;

    icetRaiseDebug("In icetDrawFrame");

    {
        IceTBoolean isDrawing;
        icetGetBooleanv(ICET_IS_DRAWING_FRAME, &isDrawing);
        if (isDrawing) {
            icetRaiseError("Recursive frame draw detected.",
                           ICET_INVALID_OPERATION);
            return icetImageNull();
        }
    }

    icetStateResetTiming();
    icetTimingDrawFrameBegin();

    icetStateSetDoublev(ICET_PROJECTION_MATRIX, 16, projection_matrix);
    icetStateSetDoublev(ICET_MODELVIEW_MATRIX, 16, modelview_matrix);

    drawUseBackgroundColor(background_color,
                           &background_color_word,
                           &need_color_correction);

    icetGetIntegerv(ICET_FRAME_COUNT, &frame_count);
    frame_count++;
    icetStateSetIntegerv(ICET_FRAME_COUNT, 1, &frame_count);

    drawProjectBounds();

    {
        IceTEnum strategy;
        icetGetEnumv(ICET_STRATEGY, &strategy);

        /* drawCollectTileInformation does an allgather to get information
         * about the tiles in other processes.  These variables are
         * ICET_ALL_CONTAINED_TILES_MASKS, ICET_TILE_CONTRIB_COUNTS, and
         * ICET_TOTAL_IMAGE_COUNT.  However, the sequential strategy ignores
         * this information and just uses all processes for all tiles.  When
         * compositing a single tile, this is a fine strategy and we can save
         * a significant proportion of frame time by skipping this step. */
        if (strategy != ICET_STRATEGY_SEQUENTIAL) {
            drawCollectTileInformation();
        }
    }

    {
        IceTInt tile_displayed;
        icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

        if (tile_displayed >= 0) {
            const IceTInt *tile_viewports
                = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
            IceTInt num_pixels = (  tile_viewports[4*tile_displayed+2]
                                  * tile_viewports[4*tile_displayed+3] );
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, tile_displayed);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, num_pixels);
        } else {
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
        }
    }

    image = drawInvokeStrategy();

    /* Correct background color where applicable. */
    if (need_color_correction) {
        drawCorrectBackground(image, background_color, background_color_word);
    }

    /* Calculate times. */
    icetGetDoublev(ICET_RENDER_TIME, &render_time);
    icetGetDoublev(ICET_BUFFER_READ_TIME, &buf_read_time);

    icetTimingDrawFrameEnd();

    icetGetDoublev(ICET_TOTAL_DRAW_TIME, &total_time);

    compose_time = total_time - render_time - buf_read_time;
    icetStateSetDouble(ICET_COMPOSITE_TIME, compose_time);

    icetStateSetDouble(ICET_BUFFER_WRITE_TIME, 0.0);

    icetStateCheckMemory();

    return image;
}